

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O2

rcode __thiscall olc::PixelGameEngine::Start(PixelGameEngine *this)

{
  int iVar1;
  rcode rVar2;
  thread t;
  thread local_30;
  PixelGameEngine *local_28;
  code *local_20;
  undefined8 local_18;
  
  iVar1 = (**(code **)(*platform + 0x10))();
  rVar2 = FAIL;
  if (iVar1 == 1) {
    local_20 = (code *)0x1e0000001e;
    iVar1 = (**(code **)(*platform + 0x38))(platform,&local_20,&this->vWindowSize,this->bFullScreen)
    ;
    if (iVar1 == 1) {
      olc_UpdateWindowSize(this,(this->vWindowSize).x,(this->vWindowSize).y);
      LOCK();
      bAtomActive = 1;
      UNLOCK();
      local_20 = EngineThread;
      local_18 = 0;
      local_28 = this;
      std::thread::thread<void(olc::PixelGameEngine::*)(),olc::PixelGameEngine*,void>
                (&local_30,(type *)&local_20,&local_28);
      (**(code **)(*platform + 0x48))();
      std::thread::join();
      iVar1 = (**(code **)(*platform + 0x18))();
      rVar2 = (rcode)(iVar1 == 1);
      std::thread::~thread(&local_30);
    }
  }
  return rVar2;
}

Assistant:

olc::rcode PixelGameEngine::Start()
	{
		if (platform->ApplicationStartUp() != olc::OK) return olc::FAIL;

		// Construct the window
		if (platform->CreateWindowPane({ 30,30 }, vWindowSize, bFullScreen) != olc::OK) return olc::FAIL;
		olc_UpdateWindowSize(vWindowSize.x, vWindowSize.y);

		// Start the thread
		bAtomActive = true;
		std::thread t = std::thread(&PixelGameEngine::EngineThread, this);

		// Some implementations may form an event loop here
		platform->StartSystemEventLoop();

		// Wait for thread to be exited
		t.join();

		if (platform->ApplicationCleanUp() != olc::OK) return olc::FAIL;

		return olc::OK;
	}